

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O2

void anon_unknown.dwarf_21986b::readValidateFile
               (char *pFilename,int pHeight,int pWidth,EImageType pImageType,bool pIsStereo)

{
  Slice *pSVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int *piVar5;
  int pNbChannels;
  undefined8 *puVar6;
  ulong uVar7;
  undefined **ppuVar8;
  ulong uVar9;
  int pWidth_local;
  int pHeight_local;
  ulong local_100;
  Array2D<Imath_3_2::half> lPixelsLeft;
  InputFile lFile;
  Array2D<Imath_3_2::half> lPixels;
  FrameBuffer lInputFrameBuffer;
  Slice local_68 [56];
  
  if (pImageType == IMAGE_TYPE_RGB) {
    pNbChannels = 3;
  }
  else {
    if (pImageType == IMAGE_TYPE_OTHER) {
      pNbChannels = 2;
      bVar2 = true;
      goto LAB_0017ca8a;
    }
    pNbChannels = 4;
  }
  bVar2 = false;
LAB_0017ca8a:
  lPixels._data = (half *)0x0;
  lPixels._sizeX = 0;
  lPixels._sizeY = 0;
  pWidth_local = pWidth;
  pHeight_local = pHeight;
  Imf_3_2::Array2D<Imath_3_2::half>::resizeErase
            (&lPixels,(long)pHeight,(long)(pWidth * pNbChannels));
  if (pIsStereo) {
    lPixelsLeft._sizeX = 0;
    lPixelsLeft._sizeY = 0;
    lPixelsLeft._data = (half *)0x0;
    Imf_3_2::Array2D<Imath_3_2::half>::resizeErase
              (&lPixelsLeft,(long)pHeight,(long)(pWidth * pNbChannels));
    iVar4 = Imf_3_2::globalThreadCount();
    Imf_3_2::InputFile::InputFile(&lFile,pFilename,iVar4);
    Imf_3_2::InputFile::header();
    piVar5 = (int *)Imf_3_2::Header::dataWindow();
    iVar4 = piVar5[1];
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar9 = (ulong)(uint)(pNbChannels * 2);
    local_100 = (long)((piVar5[2] - *piVar5) + 1) * uVar9;
    ppuVar8 = &(anonymous_namespace)::CHANNEL_NAMES_LEFT;
    puVar6 = &(anonymous_namespace)::CHANNEL_NAMES;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 2) {
      pSVar1 = (Slice *)*puVar6;
      Imf_3_2::Slice::Slice
                (local_68,HALF,(char *)((long)&(lPixels._data)->_h + uVar7),uVar9,local_100,1,1,
                 (double)*(float *)(_imath_half_to_float_table +
                                   (ulong)(anonymous_namespace)::ALPHA_DEFAULT_VALUE * 4),false,
                 false);
      Imf_3_2::FrameBuffer::insert((char *)&lInputFrameBuffer,pSVar1);
      pSVar1 = (Slice *)*ppuVar8;
      Imf_3_2::Slice::Slice
                (local_68,HALF,(char *)((long)&(lPixelsLeft._data)->_h + uVar7),uVar9,local_100,1,1,
                 (double)*(float *)(_imath_half_to_float_table +
                                   (ulong)(anonymous_namespace)::ALPHA_DEFAULT_VALUE * 4),false,
                 false);
      Imf_3_2::FrameBuffer::insert((char *)&lInputFrameBuffer,pSVar1);
      ppuVar8 = ppuVar8 + 1;
      puVar6 = puVar6 + 1;
    }
    Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&lFile);
    Imf_3_2::InputFile::readPixels((int)&lFile,iVar4);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&lInputFrameBuffer);
    Imf_3_2::InputFile::~InputFile(&lFile);
    validatePixels(&pHeight_local,&pWidth_local,&lPixels,pNbChannels,false);
    validatePixels(&pHeight_local,&pWidth_local,&lPixelsLeft,pNbChannels,true);
    Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&lPixelsLeft);
  }
  else {
    iVar4 = Imf_3_2::globalThreadCount();
    Imf_3_2::InputFile::InputFile((InputFile *)&lPixelsLeft,pFilename,iVar4);
    Imf_3_2::InputFile::header();
    piVar5 = (int *)Imf_3_2::Header::dataWindow();
    iVar4 = piVar5[1];
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar9 = (ulong)(uint)(pNbChannels * 2);
    local_100 = (long)((piVar5[2] - *piVar5) + 1) * uVar9;
    puVar6 = &(anonymous_namespace)::CHANNEL_NAMES;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 2) {
      pSVar1 = (Slice *)*puVar6;
      Imf_3_2::Slice::Slice
                (local_68,HALF,(char *)((long)&(lPixels._data)->_h + uVar7),uVar9,local_100,1,1,
                 (double)*(float *)(_imath_half_to_float_table +
                                   (ulong)(anonymous_namespace)::ALPHA_DEFAULT_VALUE * 4),false,
                 false);
      Imf_3_2::FrameBuffer::insert((char *)&lInputFrameBuffer,pSVar1);
      puVar6 = puVar6 + 1;
    }
    Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&lPixelsLeft);
    cVar3 = Imf_3_2::InputFile::isOptimizationEnabled();
    if (cVar3 == '\0') {
      std::operator<<((ostream *)&std::cout," optimization disabled\n");
    }
    else {
      std::operator<<((ostream *)&std::cout," optimization enabled\n");
      if (bVar2) {
        std::operator<<((ostream *)&std::cerr,
                        " error: isOptimizationEnabled returned TRUE, but optimization not known to work for two channel images\n"
                       );
        __assert_fail("pNbChannels != 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testOptimized.cpp"
                      ,0x14a,
                      "void (anonymous namespace)::readPixels(const char *, int, Array2D<half> &)");
      }
    }
    Imf_3_2::InputFile::readPixels((int)&lPixelsLeft,iVar4);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&lInputFrameBuffer);
    Imf_3_2::InputFile::~InputFile((InputFile *)&lPixelsLeft);
    validatePixels(&pHeight_local,&pWidth_local,&lPixels,pNbChannels,false);
  }
  Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&lPixels);
  return;
}

Assistant:

void
readValidateFile (
    const char pFilename[],
    int        pHeight,
    int        pWidth,
    EImageType pImageType,
    bool       pIsStereo)
{
    const int lNbChannels = getNbChannels (pImageType);

    Array2D<half> lPixels;
    lPixels.resizeErase (pHeight, pWidth * lNbChannels);
    //readPixels(pFilename, lNbChannels, lPixels);
    //writePixels("pkTest.exr", pHeight, pWidth, lPixels, lNbChannels, NO_COMPRESSION);

    if (pIsStereo)
    {
        Array2D<half> lPixelsLeft;
        lPixelsLeft.resizeErase (pHeight, pWidth * lNbChannels);
        readPixels (pFilename, lNbChannels, lPixels, lPixelsLeft);
        validatePixels (pHeight, pWidth, lPixels, lNbChannels, false);
        validatePixels (pHeight, pWidth, lPixelsLeft, lNbChannels, true);
    }
    else
    {
        readPixels (pFilename, lNbChannels, lPixels);
        validatePixels (pHeight, pWidth, lPixels, lNbChannels, false);
    }
}